

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintImports(Generator *this)

{
  FileDescriptor *pFVar1;
  int i;
  long lVar2;
  string module_name;
  string sStack_48;
  
  for (lVar2 = 0; lVar2 < *(int *)(this->file_ + 0x18); lVar2 = lVar2 + 1) {
    anon_unknown_0::ModuleName
              (&sStack_48,(string *)**(undefined8 **)(*(long *)(this->file_ + 0x20) + lVar2 * 8));
    io::Printer::Print(this->printer_,"import $module$\n","module",&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  io::Printer::Print(this->printer_,"\n");
  for (lVar2 = 0; pFVar1 = this->file_, lVar2 < *(int *)(pFVar1 + 0x28); lVar2 = lVar2 + 1) {
    anon_unknown_0::ModuleName
              (&sStack_48,
               (string *)
               **(undefined8 **)
                 (*(long *)(pFVar1 + 0x20) +
                 (long)*(int *)(*(long *)(pFVar1 + 0x30) + lVar2 * 4) * 8));
    io::Printer::Print(this->printer_,"from $module$ import *\n","module",&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintImports() const {
  for (int i = 0; i < file_->dependency_count(); ++i) {
    string module_name = ModuleName(file_->dependency(i)->name());
    printer_->Print("import $module$\n", "module",
                    module_name);
  }
  printer_->Print("\n");

  // Print public imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    string module_name = ModuleName(file_->public_dependency(i)->name());
    printer_->Print("from $module$ import *\n", "module", module_name);
  }
  printer_->Print("\n");
}